

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O0

void __thiscall QFbScreen::addWindow(QFbScreen *this,QFbWindow *window)

{
  QFbBackingStore *store;
  bool bVar1;
  QList<QFbBackingStore_*> *this_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  parameter_type pQVar4;
  QWindow *pQVar5;
  QFbWindow *in_RSI;
  QFbScreen *in_RDI;
  long in_FS_OFFSET;
  QWindow *w;
  QFbBackingStore *bs;
  int i;
  parameter_type in_stack_ffffffffffffffa8;
  int local_2c;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QFbWindow_*>::prepend((QList<QFbWindow_*> *)0x12af58,in_stack_ffffffffffffffa8);
  bVar1 = QList<QFbBackingStore_*>::isEmpty((QList<QFbBackingStore_*> *)0x12af69);
  if (!bVar1) {
    local_2c = 0;
    while( true ) {
      this_00 = (QList<QFbBackingStore_*> *)(long)local_2c;
      qVar2 = QList<QFbBackingStore_*>::size(&in_RDI->mPendingBackingStores);
      if (qVar2 <= (long)this_00) break;
      ppQVar3 = QList<QFbBackingStore_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffa8);
      store = *ppQVar3;
      in_stack_ffffffffffffffa8 = (parameter_type)QPlatformBackingStore::window();
      pQVar4 = (parameter_type)QPlatformWindow::window();
      if (in_stack_ffffffffffffffa8 == pQVar4) {
        QFbWindow::setBackingStore(in_RSI,store);
        QList<QFbBackingStore_*>::removeAt(this_00,(qsizetype)in_stack_ffffffffffffffa8);
        break;
      }
      local_2c = local_2c + 1;
    }
  }
  local_18 = (**(code **)(*(long *)in_RSI + 0x30))();
  (**(code **)(*(long *)in_RDI + 0xd0))(in_RDI,local_18);
  pQVar5 = topWindow(in_RDI);
  QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
            (pQVar5,7);
  (**(code **)(*(long *)in_RDI + 0xb8))(in_RDI,pQVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbScreen::addWindow(QFbWindow *window)
{
    mWindowStack.prepend(window);
    if (!mPendingBackingStores.isEmpty()) {
        //check if we have a backing store for this window
        for (int i = 0; i < mPendingBackingStores.size(); ++i) {
            QFbBackingStore *bs = mPendingBackingStores.at(i);
            // this gets called during QWindow::create() at a point where the
            // invariant (window->handle()->window() == window) is broken
            if (bs->window() == window->window()) {
                window->setBackingStore(bs);
                mPendingBackingStores.removeAt(i);
                break;
            }
        }
    }
    setDirty(window->geometry());
    QWindow *w = topWindow();
    QWindowSystemInterface::handleFocusWindowChanged(w);
    topWindowChanged(w);
}